

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclConfig.cpp
# Opt level: O1

vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> * __thiscall
xmrig::OclConfig::get
          (vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>
           *__return_storage_ptr__,OclConfig *this,Miner *miner,OclPlatform *platform,
          vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *devices)

{
  pointer pOVar1;
  pointer pOVar2;
  long *plVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  OclThread *thread;
  pointer pOVar8;
  const_iterator __begin3;
  long *__args_5;
  int64_t affinity;
  Miner *local_50;
  String local_48;
  pointer local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = miner;
  String::String(&local_48,"cn/blur");
  pmVar4 = std::
           map<xmrig::String,_xmrig::OclThreads,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::OclThreads>_>_>
           ::at(&(this->m_threads).m_profiles,&local_48);
  if (local_48.m_data != (char *)0x0) {
    operator_delete__(local_48.m_data);
  }
  pOVar8 = (pmVar4->m_data).super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (pmVar4->m_data).super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pOVar8 != pOVar1) {
    std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::reserve
              (__return_storage_ptr__,((long)pOVar1 - (long)pOVar8 >> 3) * 0x1c71c71c71c71c72);
    pOVar8 = (pmVar4->m_data).
             super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_38 = (pmVar4->m_data).
               super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (pOVar8 != local_38) {
      do {
        uVar5 = (ulong)pOVar8->m_index;
        pOVar2 = (devices->super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar7 = ((long)(devices->
                       super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 3) *
                0x4ec4ec4ec4ec4ec5;
        if (uVar7 < uVar5 || uVar7 - uVar5 == 0) {
          pcVar6 = ocl_tag();
          Log::print(INFO,
                     "%s\x1b[0;33m skip non-existing device with index \x1b[0m\x1b[1;33m%u\x1b[0m",
                     pcVar6,(ulong)pOVar8->m_index);
        }
        else {
          __args_5 = (pOVar8->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start;
          plVar3 = (pOVar8->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if ((ulong)((long)plVar3 - (long)__args_5) < 9) {
            std::vector<xmrig::OclLaunchData,std::allocator<xmrig::OclLaunchData>>::
            emplace_back<xmrig::Miner_const*&,xmrig::OclConfig_const&,xmrig::OclPlatform_const&,xmrig::OclThread_const&,xmrig::OclDevice_const&,long_const&>
                      ((vector<xmrig::OclLaunchData,std::allocator<xmrig::OclLaunchData>> *)
                       __return_storage_ptr__,&local_50,this,platform,pOVar8,pOVar2 + uVar5,__args_5
                      );
          }
          else {
            for (; __args_5 != plVar3; __args_5 = __args_5 + 1) {
              local_48.m_data = (char *)*__args_5;
              std::vector<xmrig::OclLaunchData,std::allocator<xmrig::OclLaunchData>>::
              emplace_back<xmrig::Miner_const*&,xmrig::OclConfig_const&,xmrig::OclPlatform_const&,xmrig::OclThread_const&,xmrig::OclDevice_const&,long&>
                        ((vector<xmrig::OclLaunchData,std::allocator<xmrig::OclLaunchData>> *)
                         __return_storage_ptr__,&local_50,this,platform,pOVar8,
                         (devices->
                         super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>).
                         _M_impl.super__Vector_impl_data._M_start + pOVar8->m_index,
                         (long *)&local_48);
            }
          }
        }
        pOVar8 = pOVar8 + 1;
      } while (pOVar8 != local_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<xmrig::OclLaunchData> xmrig::OclConfig::get(const Miner *miner, const OclPlatform &platform, const std::vector<OclDevice> &devices) const
{
    std::vector<OclLaunchData> out;
    const auto &threads = m_threads.get();

    if (threads.isEmpty()) {
        return out;
    }

    out.reserve(threads.count() * 2);

    for (const auto &thread : threads.data()) {
        if (thread.index() >= devices.size()) {
            LOG_INFO("%s" YELLOW(" skip non-existing device with index ") YELLOW_BOLD("%u"), ocl_tag(), thread.index());
            continue;
        }

        if (thread.threads().size() > 1) {
            for (int64_t affinity : thread.threads()) {
                out.emplace_back(miner, *this, platform, thread, devices[thread.index()], affinity);
            }
        }
        else {
            out.emplace_back(miner, *this, platform, thread, devices[thread.index()], thread.threads().front());
        }
    }

    return out;
}